

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uint-table.c
# Opt level: O1

_Bool Curl_uint_tbl_add(uint_tbl *tbl,void *entry,uint *pkey)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  void **ppvVar5;
  
  if (pkey != (uint *)0x0 && entry != (void *)0x0) {
    *pkey = 0xffffffff;
    uVar1 = tbl->nrows;
    uVar2 = tbl->nentries;
    if (uVar2 != uVar1) {
      uVar4 = tbl->last_key_added;
      if (uVar1 <= tbl->last_key_added) {
        uVar4 = uVar1;
      }
      uVar4 = uVar4 + 1;
      if (uVar4 < uVar1) {
        ppvVar5 = tbl->rows + uVar4;
        uVar3 = uVar4;
        do {
          if (*ppvVar5 == (void *)0x0) goto LAB_001623f8;
          uVar3 = uVar3 + 1;
          ppvVar5 = ppvVar5 + 1;
        } while (uVar1 != uVar3);
      }
      uVar3 = 0;
      if (uVar4 != 0) {
        ppvVar5 = tbl->rows;
        do {
          if (*ppvVar5 == (void *)0x0) {
LAB_001623f8:
            *ppvVar5 = entry;
            tbl->nentries = uVar2 + 1;
            tbl->last_key_added = uVar3;
            *pkey = uVar3;
            return true;
          }
          uVar3 = uVar3 + 1;
          ppvVar5 = ppvVar5 + 1;
        } while (uVar4 != uVar3);
      }
    }
  }
  return false;
}

Assistant:

bool Curl_uint_tbl_add(struct uint_tbl *tbl, void *entry, unsigned int *pkey)
{
  unsigned int key, start_pos;

  DEBUGASSERT(tbl->init == CURL_UINT_TBL_MAGIC);
  if(!entry || !pkey)
    return FALSE;
  *pkey = UINT_MAX; /* always invalid */
  if(tbl->nentries == tbl->nrows)  /* full */
    return FALSE;

  start_pos = CURLMIN(tbl->last_key_added, tbl->nrows) + 1;
  for(key = start_pos; key < tbl->nrows; ++key) {
    if(!tbl->rows[key]) {
      tbl->rows[key] = entry;
      tbl->nentries++;
      tbl->last_key_added = key;
      *pkey = key;
      return TRUE;
    }
  }
  /* no free entry at or above tbl->maybe_next_key, wrap around */
  for(key = 0; key < start_pos; ++key) {
    if(!tbl->rows[key]) {
      tbl->rows[key] = entry;
      tbl->nentries++;
      tbl->last_key_added = key;
      *pkey = key;
      return TRUE;
    }
  }
  /* Did not find any free row? Should not happen */
  DEBUGASSERT(0);
  return FALSE;
}